

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toFloat.cpp
# Opt level: O3

int main(void)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  int i;
  uint uVar4;
  
  lVar1 = std::cout;
  *(undefined8 *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) = 9;
  *(uint *)(__gmon_start__ + *(long *)(lVar1 + -0x18)) =
       *(uint *)(__gmon_start__ + *(long *)(lVar1 + -0x18)) & 0xffffffb5 | 8;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "//\n// This is an automatically generated file.\n// Do not edit.\n//\n\n",0x43);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{\n    ",6);
  uVar4 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{0x",3);
    lVar1 = *(long *)(std::cout + -0x18);
    if (*(char *)(lVar1 + 0x105109) == '\0') {
      std::ios::widen((char)lVar1 + '(');
      *(undefined1 *)(lVar1 + 0x105109) = 1;
    }
    lVar2 = std::cout;
    *(undefined1 *)(lVar1 + 0x105108) = 0x30;
    *(undefined8 *)(_ITM_deregisterTMCloneTable + *(long *)(lVar2 + -0x18)) = 8;
    halfToFloat((unsigned_short)uVar4);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}, ",3);
    if ((~uVar4 & 3) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      if (uVar4 == 0xffff) break;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x10000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"};\n",3);
  return 0;
}

Assistant:

int
main ()
{
    cout.precision (9);
    cout.setf (ios_base::hex, ios_base::basefield);

    cout << "//\n"
	    "// This is an automatically generated file.\n"
	    "// Do not edit.\n"
	    "//\n\n";

    cout << "{\n    ";

    const int iMax = (1 << 16);

    for (int i = 0; i < iMax; i++)
    {
	cout << "{0x" << setfill ('0') << setw (8) << halfToFloat (i) << "}, ";

	if (i % 4 == 3)
	{
	    cout << "\n";

	    if (i < iMax - 1)
		cout << "    ";
	}
    }

    cout << "};\n";
    return 0;
}